

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpauseanimation.cpp
# Opt level: O1

void __thiscall QPauseAnimation::QPauseAnimation(QPauseAnimation *this,int msecs,QObject *parent)

{
  QAbstractAnimationPrivate *this_00;
  
  this_00 = (QAbstractAnimationPrivate *)operator_new(0xa8);
  QAbstractAnimationPrivate::QAbstractAnimationPrivate(this_00);
  (this_00->super_QObjectPrivate).super_QObjectData._vptr_QObjectData =
       (_func_int **)&PTR__QAbstractAnimationPrivate_006aeb28;
  *(undefined4 *)&this_00[1].super_QObjectPrivate.super_QObjectData._vptr_QObjectData = 0xfa;
  this_00->isPause = true;
  QAbstractAnimation::QAbstractAnimation((QAbstractAnimation *)this,this_00,parent);
  *(undefined ***)this = &PTR_metaObject_006aea38;
  setDuration(this,msecs);
  return;
}

Assistant:

QPauseAnimation::QPauseAnimation(int msecs, QObject *parent) : QAbstractAnimation(*new QPauseAnimationPrivate, parent)
{
    setDuration(msecs);
}